

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int create_code(archive_read *a,huffman_code *code,uchar *lengths,int numsymbols,char maxlength)

{
  huffman_tree_node *phVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *fmt;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  bool bVar8;
  uint local_60;
  int local_5c;
  
  code->numentries = 0;
  code->numallocatedentries = 0;
  iVar2 = new_node(code);
  if (iVar2 < 0) {
LAB_0012c178:
    fmt = "Unable to allocate memory for node data.";
    iVar2 = 0xc;
LAB_0012c17d:
    archive_set_error(&a->archive,iVar2,fmt);
    iVar4 = -0x1e;
  }
  else {
    code->numentries = 1;
    code->minlength = 0x7fffffff;
    code->maxlength = -0x80000000;
    local_60 = 1;
    uVar5 = 0;
    local_5c = 2;
    iVar2 = numsymbols;
    do {
      if (0 < numsymbols) {
        uVar6 = 0;
        do {
          if (local_60 == lengths[uVar6]) {
            free(code->table);
            code->table = (huffman_table_entry *)0x0;
            if (code->maxlength < (int)local_60) {
              code->maxlength = local_60;
            }
            if ((int)local_60 < code->minlength) {
              code->minlength = local_60;
            }
            iVar4 = 0;
            iVar7 = local_5c;
            do {
              phVar1 = code->tree;
              if (phVar1[iVar4].branches[0] == phVar1[iVar4].branches[1]) goto LAB_0012c14d;
              bVar8 = (uVar5 >> (iVar7 - 2U & 0x1f) & 1) != 0;
              if (phVar1[iVar4].branches[bVar8] < 0) {
                iVar3 = new_node(code);
                if (iVar3 < 0) goto LAB_0012c178;
                iVar3 = code->numentries;
                code->numentries = iVar3 + 1;
                code->tree[iVar4].branches[bVar8] = iVar3;
              }
              phVar1 = code->tree;
              iVar4 = phVar1[iVar4].branches[bVar8];
              iVar7 = iVar7 + -1;
            } while (1 < iVar7);
            if ((phVar1[iVar4].branches[0] != -1) || (phVar1[iVar4].branches[1] != -2)) {
LAB_0012c14d:
              fmt = "Prefix found";
              iVar2 = 0x54;
              goto LAB_0012c17d;
            }
            phVar1[iVar4].branches[0] = (int)uVar6;
            phVar1[iVar4].branches[1] = (int)uVar6;
            uVar5 = uVar5 + 1;
            iVar4 = iVar2 + -1;
            bVar8 = iVar2 < 2;
            iVar2 = iVar4;
            if (bVar8) break;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != (uint)numsymbols);
      }
      iVar4 = 0;
      if (iVar2 < 1) {
        return 0;
      }
      uVar5 = uVar5 * 2;
      local_60 = local_60 + 1;
      local_5c = local_5c + 1;
    } while (local_60 != 0x10);
  }
  return iVar4;
}

Assistant:

static int
create_code(struct archive_read *a, struct huffman_code *code,
            unsigned char *lengths, int numsymbols, char maxlength)
{
  int i, j, codebits = 0, symbolsleft = numsymbols;

  code->numentries = 0;
  code->numallocatedentries = 0;
  if (new_node(code) < 0) {
    archive_set_error(&a->archive, ENOMEM,
                      "Unable to allocate memory for node data.");
    return (ARCHIVE_FATAL);
  }
  code->numentries = 1;
  code->minlength = INT_MAX;
  code->maxlength = INT_MIN;
  codebits = 0;
  for(i = 1; i <= maxlength; i++)
  {
    for(j = 0; j < numsymbols; j++)
    {
      if (lengths[j] != i) continue;
      if (add_value(a, code, j, codebits, i) != ARCHIVE_OK)
        return (ARCHIVE_FATAL);
      codebits++;
      if (--symbolsleft <= 0)
        break;
    }
    if (symbolsleft <= 0)
      break;
    codebits <<= 1;
  }
  return (ARCHIVE_OK);
}